

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O1

void __thiscall avro::BinaryDecoder::skipFixed(BinaryDecoder *this,size_t n)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  InputStream *pIVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar4;
  ulong uVar5;
  
  puVar1 = (this->in_).next_;
  puVar2 = (this->in_).end_;
  uVar5 = (long)puVar2 - (long)puVar1;
  lVar4 = n - uVar5;
  if (uVar5 <= n && lVar4 != 0) {
    (this->in_).next_ = puVar2;
    pIVar3 = (this->in_).in_;
    UNRECOVERED_JUMPTABLE = pIVar3->_vptr_InputStream[4];
    (*UNRECOVERED_JUMPTABLE)(pIVar3,lVar4,puVar2,UNRECOVERED_JUMPTABLE);
    return;
  }
  (this->in_).next_ = puVar1 + n;
  return;
}

Assistant:

void skipBytes(size_t n) {
        if (n > static_cast<size_t>(end_ - next_)) {
            n -= end_ - next_;
            next_ = end_;
            in_->skip(n);
        } else {
            next_ += n;
        }
    }